

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

Vec_Int_t * Gia_ManCollectSeq(Gia_Man_t *p,int *pPos,int nPos)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *p_01;
  int local_34;
  int iRoot;
  int i;
  Vec_Int_t *vRoots;
  Vec_Int_t *vObjs;
  int nPos_local;
  int *pPos_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  for (local_34 = 0; local_34 < nPos; local_34 = local_34 + 1) {
    pObj = Gia_ManPo(p,pPos[local_34]);
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(p_00,iVar1);
  }
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrentId(p,0);
  p_01 = Vec_IntAlloc(1000);
  Vec_IntPush(p_01,0);
  for (local_34 = 0; iVar1 = Vec_IntSize(p_00), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Vec_IntEntry(p_00,local_34);
    Gia_ManCollectSeq_rec(p,iVar1,p_00,p_01);
  }
  Vec_IntFree(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Gia_ManCollectSeq( Gia_Man_t * p, int * pPos, int nPos )
{
    Vec_Int_t * vObjs, * vRoots;
    int i, iRoot;
    // collect roots
    vRoots = Vec_IntAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ManPo(p, pPos[i])) );
    // start trav IDs
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    // collect objects
    vObjs = Vec_IntAlloc( 1000 );
    Vec_IntPush( vObjs, 0 );
    Vec_IntForEachEntry( vRoots, iRoot, i )
        Gia_ManCollectSeq_rec( p, iRoot, vRoots, vObjs );
    Vec_IntFree( vRoots );
    return vObjs;
}